

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyhair2pbrt.cpp
# Opt level: O1

bool __thiscall cyhair::CyHair::Load(CyHair *this,char *filename)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  undefined4 uVar8;
  char *pcVar7;
  ulong uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  CyHairHeader header;
  int local_98;
  undefined8 local_94;
  uint uStack_8c;
  int iStack_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  float local_74;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  uVar8 = 0;
  sVar5 = fread(&local_98,0x80,1,__stream);
  if ((sVar5 == 1) && (local_98 == 0x52494148)) {
    this->default_thickness_ = (float)(undefined4)local_84;
    this->default_transparency_ = (float)local_84._4_4_;
    *(undefined8 *)this->default_color_ = uStack_7c;
    this->default_color_[2] = local_74;
    auVar4._8_4_ = uStack_8c;
    auVar4._0_8_ = local_94;
    auVar4._12_4_ = iStack_88;
    auVar11._4_4_ = uStack_8c;
    auVar11._0_4_ = uStack_8c;
    auVar11._8_4_ = uStack_8c;
    auVar11._12_4_ = uStack_8c;
    auVar11 = vpand_avx(auVar11,_DAT_00104010);
    uVar9 = vptestnmd_avx512vl(auVar11,auVar11);
    auVar11 = vpshufd_avx(auVar4,0xd2);
    this->flags_ = auVar11._0_4_;
    this->num_strands_ = auVar11._4_4_;
    this->total_points_ = auVar11._8_4_;
    this->default_segments_ = auVar11._12_4_;
    if ((uVar9 & 8) == 0) {
      if (0 < iStack_88 || (uStack_8c & 1) != 0) {
        if ((uStack_8c & 1) == 0) {
LAB_001024dc:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[CyHair] Has points.",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
          std::vector<float,_std::allocator<float>_>::resize
                    (&this->points_,(ulong)(this->total_points_ * 3));
          sVar5 = fread((this->points_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)this->total_points_ * 0xc,1,__stream
                       );
          if (sVar5 == 1) {
            if ((uVar9 & 4) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"[CyHair] Has thickness.",0x17);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              std::vector<float,_std::allocator<float>_>::resize
                        (&this->thicknesses_,(ulong)this->total_points_);
              sVar5 = fread((this->thicknesses_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start,(ulong)this->total_points_ << 2
                            ,1,__stream);
              if (sVar5 != 1) {
                pcVar7 = "Failed to read CyHair thickness data.";
                lVar6 = 0x25;
                goto LAB_001027be;
              }
            }
            if ((uVar9 & 2) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"[CyHair] Has transparency.",0x1a);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              std::vector<float,_std::allocator<float>_>::resize
                        (&this->transparencies_,(ulong)this->total_points_);
              sVar5 = fread((this->transparencies_).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)this->total_points_ << 2,1,
                            __stream);
              if (sVar5 != 1) {
                pcVar7 = "Failed to read CyHair transparencies data.";
                lVar6 = 0x2a;
                goto LAB_001027be;
              }
            }
            if ((uVar9 & 1) != 0) {
LAB_001026af:
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        (&this->strand_offsets_,(ulong)this->num_strands_);
              puVar1 = (this->strand_offsets_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              *puVar1 = 0;
              if (1 < this->num_strands_) {
                puVar2 = (this->segments_).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start;
                puVar3 = (this->segments_).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                uVar9 = 1;
                do {
                  if (puVar2 == puVar3) {
                    uVar10 = this->default_segments_;
                  }
                  else {
                    uVar10 = (uint)puVar2[uVar9 - 1];
                  }
                  puVar1[uVar9] = uVar10 + 1 + puVar1[uVar9 - 1];
                  uVar9 = uVar9 + 1;
                } while (uVar9 < this->num_strands_);
                return true;
              }
              return true;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[CyHair] Has color.",0x13);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::vector<float,_std::allocator<float>_>::resize
                      (&this->colors_,(ulong)(this->total_points_ * 3));
            sVar5 = fread((this->colors_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)this->total_points_ * 0xc,1,
                          __stream);
            if (sVar5 == 1) goto LAB_001026af;
            pcVar7 = "Failed to read CyHair colors data.";
          }
          else {
            pcVar7 = "Failed to read CyHair points data.";
          }
          lVar6 = 0x22;
        }
        else {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                    (&this->segments_,CONCAT44(uVar8,(int)local_94));
          sVar5 = fread((this->segments_).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)this->num_strands_ * 2,1,__stream);
          if (sVar5 == 1) goto LAB_001024dc;
          pcVar7 = "Failed to read CyHair segments data.";
          lVar6 = 0x24;
        }
LAB_001027be:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_001027ce;
      }
      pcVar7 = "No valid segment information in CyHair.";
      lVar6 = 0x27;
    }
    else {
      pcVar7 = "No point data in CyHair.";
      lVar6 = 0x18;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
  }
  else {
LAB_001027ce:
    fclose(__stream);
  }
  return false;
}

Assistant:

bool CyHair::Load(const char *filename) {
  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  assert(sizeof(CyHairHeader) == 128);
  CyHairHeader header;

  if (1 != fread(&header, 128, 1, fp)) {
    fclose(fp);
    return false;
  }
  if (memcmp(header.magic, "HAIR", 4) != 0) {
    fclose(fp);
    return false;
  }

  flags_ = header.flags;
  default_thickness_ = header.default_thickness;
  default_transparency_ = header.default_transparency;
  default_segments_ = static_cast<int>(header.default_segments);
  default_color_[0] = header.default_color[0];
  default_color_[1] = header.default_color[1];
  default_color_[2] = header.default_color[2];

  const bool has_segments = flags_ & 0x1;
  const bool has_points = flags_ & 0x2;
  const bool has_thickness = flags_ & 0x4;
  const bool has_transparency = flags_ & 0x8;
  const bool has_color = flags_ & 0x10;

  num_strands_ = header.num_strands;
  total_points_ = header.total_points;

  if (!has_points) {
    std::cout << "No point data in CyHair." << std::endl;
    return false;
  }

  if ((default_segments_ < 1) && (!has_segments)) {
    std::cout << "No valid segment information in CyHair." << std::endl;
    return false;
  }

  // First read all strand data from a file.
  if (has_segments) {
    segments_.resize(num_strands_);
    if (1 !=
        fread(&segments_[0], sizeof(unsigned short) * num_strands_, 1, fp)) {
      std::cout << "Failed to read CyHair segments data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_points) {
    std::cout << "[CyHair] Has points." << std::endl;
    points_.resize(3 * total_points_);
    size_t n = fread(&points_[0], total_points_ * sizeof(float) * 3, 1, fp);
    if (1 != n) {
      std::cout << "Failed to read CyHair points data." << std::endl;
      fclose(fp);
      return false;
    }
  }
  if (has_thickness) {
    std::cout << "[CyHair] Has thickness." << std::endl;
    thicknesses_.resize(total_points_);
    if (1 != fread(&thicknesses_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair thickness data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_transparency) {
    std::cout << "[CyHair] Has transparency." << std::endl;
    transparencies_.resize(total_points_);
    if (1 != fread(&transparencies_[0], total_points_ * sizeof(float), 1, fp)) {
      std::cout << "Failed to read CyHair transparencies data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  if (has_color) {
    std::cout << "[CyHair] Has color." << std::endl;
    colors_.resize(3 * total_points_);
    if (1 != fread(&colors_[0], total_points_ * sizeof(float) * 3, 1, fp)) {
      std::cout << "Failed to read CyHair colors data." << std::endl;
      fclose(fp);
      return false;
    }
  }

  // Build strand offset table.
  strand_offsets_.resize(num_strands_);
  strand_offsets_[0] = 0;
  for (size_t i = 1; i < num_strands_; i++) {
    int num_segments = segments_.empty() ? default_segments_ : segments_[i - 1];
    strand_offsets_[i] =
        strand_offsets_[i - 1] + static_cast<unsigned int>(num_segments + 1);
  }

  return true;
}